

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void dateFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  long in_FS_OFFSET;
  DateTime x;
  char zBuf [100];
  DateTime DStack_b8;
  char local_88 [112];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = isDate(context,argc,argv,&DStack_b8);
  if (iVar1 == 0) {
    computeYMD(&DStack_b8);
    sqlite3_snprintf(100,local_88,"%04d-%02d-%02d",(ulong)(uint)DStack_b8.Y,(ulong)(uint)DStack_b8.M
                     ,(ulong)(uint)DStack_b8.D);
    setResultStrOrError(context,local_88,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void dateFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    char zBuf[100];
    computeYMD(&x);
    sqlite3_snprintf(sizeof(zBuf), zBuf, "%04d-%02d-%02d", x.Y, x.M, x.D);
    sqlite3_result_text(context, zBuf, -1, SQLITE_TRANSIENT);
  }
}